

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O1

void initBiomeNoise(BiomeNoise *bn,int mc)

{
  SplineStack *ss;
  int iVar1;
  int iVar2;
  int iVar3;
  Spline *pSVar4;
  Spline *pSVar5;
  Spline *pSVar6;
  Spline *pSVar7;
  Spline *pSVar8;
  Spline *pSVar9;
  
  ss = &bn->ss;
  memset(ss,0,0x2590);
  iVar1 = (bn->ss).len;
  (bn->ss).len = iVar1 + 1;
  pSVar9 = (bn->ss).stack + iVar1;
  (bn->ss).stack[iVar1].typ = 0;
  pSVar4 = createLandSpline(ss,-0.15,0.0,0.0,0.1,0.0,-0.03,0);
  pSVar5 = createLandSpline(ss,-0.1,0.03,0.1,0.1,0.01,-0.03,0);
  pSVar6 = createLandSpline(ss,-0.1,0.03,0.1,0.7,0.01,-0.03,1);
  pSVar7 = createLandSpline(ss,-0.05,0.03,0.1,1.0,0.01,0.01,1);
  iVar2 = (bn->ss).flen;
  (bn->ss).flen = iVar2 + 1;
  pSVar8 = (Spline *)((bn->ss).fstack + iVar2);
  pSVar8->len = 1;
  pSVar8->typ = 0x3d343958;
  iVar3 = pSVar9->len;
  (bn->ss).stack[iVar1].loc[iVar3] = -1.1;
  (bn->ss).stack[iVar1].val[iVar3] = pSVar8;
  (bn->ss).stack[iVar1].der[iVar3] = 0.0;
  pSVar9->len = iVar3 + 1;
  (bn->ss).flen = iVar2 + 2;
  pSVar8 = (Spline *)((bn->ss).fstack + (long)iVar2 + 1);
  pSVar8->len = 1;
  pSVar8->typ = -0x419c779a;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 1] = -1.02;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 1] = pSVar8;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 1] = 0.0;
  pSVar9->len = iVar3 + 2;
  (bn->ss).flen = iVar2 + 3;
  pSVar8 = (Spline *)((bn->ss).fstack + (long)iVar2 + 2);
  pSVar8->len = 1;
  pSVar8->typ = -0x419c779a;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 2] = -0.51;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 2] = pSVar8;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 2] = 0.0;
  pSVar9->len = iVar3 + 3;
  (bn->ss).flen = iVar2 + 4;
  pSVar8 = (Spline *)((bn->ss).fstack + (long)iVar2 + 3);
  pSVar8->len = 1;
  pSVar8->typ = -0x420a3d71;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 3] = -0.44;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 3] = pSVar8;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 3] = 0.0;
  pSVar9->len = iVar3 + 4;
  (bn->ss).flen = iVar2 + 5;
  pSVar8 = (Spline *)((bn->ss).fstack + (long)iVar2 + 4);
  pSVar8->len = 1;
  pSVar8->typ = -0x420a3d71;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 4] = -0.18;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 4] = pSVar8;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 4] = 0.0;
  pSVar9->len = iVar3 + 5;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 5] = -0.16;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 5] = pSVar4;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 5] = 0.0;
  pSVar9->len = iVar3 + 6;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 6] = -0.15;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 6] = pSVar4;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 6] = 0.0;
  pSVar9->len = iVar3 + 7;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 7] = -0.1;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 7] = pSVar5;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 7] = 0.0;
  pSVar9->len = iVar3 + 8;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 8] = 0.25;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 8] = pSVar6;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 8] = 0.0;
  pSVar9->len = iVar3 + 9;
  (bn->ss).stack[iVar1].loc[(long)iVar3 + 9] = 1.0;
  (bn->ss).stack[iVar1].val[(long)iVar3 + 9] = pSVar7;
  (bn->ss).stack[iVar1].der[(long)iVar3 + 9] = 0.0;
  pSVar9->len = iVar3 + 10;
  bn->sp = pSVar9;
  bn->mc = mc;
  return;
}

Assistant:

void initBiomeNoise(BiomeNoise *bn, int mc)
{
    SplineStack *ss = &bn->ss;
    memset(ss, 0, sizeof(*ss));
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_CONTINENTALNESS;

    Spline *sp1 = createLandSpline(ss, -0.15F, 0.00F, 0.0F, 0.1F, 0.00F, -0.03F, 0);
    Spline *sp2 = createLandSpline(ss, -0.10F, 0.03F, 0.1F, 0.1F, 0.01F, -0.03F, 0);
    Spline *sp3 = createLandSpline(ss, -0.10F, 0.03F, 0.1F, 0.7F, 0.01F, -0.03F, 1);
    Spline *sp4 = createLandSpline(ss, -0.05F, 0.03F, 0.1F, 1.0F, 0.01F,  0.01F, 1);

    addSplineVal(sp, -1.10F, createFixSpline(ss,  0.044F), 0.0F);
    addSplineVal(sp, -1.02F, createFixSpline(ss, -0.2222F), 0.0F);
    addSplineVal(sp, -0.51F, createFixSpline(ss, -0.2222F), 0.0F);
    addSplineVal(sp, -0.44F, createFixSpline(ss, -0.12F), 0.0F);
    addSplineVal(sp, -0.18F, createFixSpline(ss, -0.12F), 0.0F);
    addSplineVal(sp, -0.16F, sp1, 0.0F);
    addSplineVal(sp, -0.15F, sp1, 0.0F);
    addSplineVal(sp, -0.10F, sp2, 0.0F);
    addSplineVal(sp,  0.25F, sp3, 0.0F);
    addSplineVal(sp,  1.00F, sp4, 0.0F);

    bn->sp = sp;
    bn->mc = mc;
}